

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncTaskManager.hpp
# Opt level: O2

void __thiscall sftm::CAsyncTaskManager::Stop(CAsyncTaskManager *this)

{
  ulong uVar1;
  bool *pbVar2;
  ulong uVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  uVar1 = (ulong)this->m_nWorkerCount;
  pbVar2 = &(this->m_workers)._M_elems[0].m_bStopping;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    *pbVar2 = true;
    pbVar2 = pbVar2 + 0x20;
  }
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    while ((this->m_workers)._M_elems[uVar3].m_bFinished == false) {
      local_30.__r = 10;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
      std::condition_variable::notify_all();
    }
    uVar1 = (ulong)this->m_nWorkerCount;
  }
  return;
}

Assistant:

void Stop() noexcept
		{
			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
				m_workers[nWorker].Stop();

			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
			{
				while (!m_workers[nWorker].IsFinished())
				{
					std::this_thread::sleep_for(std::chrono::milliseconds(10));
					m_cvWorkerIdle.notify_all();
				}
			}
		}